

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O1

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_loadblockindex::test_method
          (chainstatemanager_loadblockindex *this)

{
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  long lVar1;
  ChainstateManager *this_01;
  pointer ppCVar2;
  uint256 *puVar3;
  int iVar4;
  base_blob<256U> *pbVar5;
  CBlockIndex *pCVar6;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar7;
  Chainstate *pCVar8;
  Chainstate *pCVar9;
  CBlockIndex *pCVar10;
  const_iterator cVar11;
  char *pcVar12;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  _Rb_tree_header *p_Var15;
  long lVar16;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined4 local_144;
  size_t local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  anon_class_8_1_3d09f077 reload_all_block_indexes;
  lazy_ostream local_110;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  CBlockIndex *assumed_tip;
  CBlockIndex *assumed_base;
  CBlockIndex *validated_tip;
  int num_indexes;
  anon_class_8_1_3d09f077 *local_b0;
  int *local_a8;
  char *local_a0;
  char *local_98;
  assertion_result local_90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar12 = "m_node.chainman";
  puVar7 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                      ,0x1a8,"test_method","m_node.chainman");
  this_01 = (puVar7->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  pCVar8 = ChainstateManager::ActiveChainstate(this_01);
  num_indexes = 0;
  TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,0x14);
  validated_tip = (CBlockIndex *)0x0;
  assumed_base = (CBlockIndex *)0x0;
  criticalblock45.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock45.super_unique_lock);
  pCVar9 = ChainstateManager::ActiveChainstate(this_01);
  ppCVar2 = (pCVar9->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar9->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar10 = (CBlockIndex *)0x0;
  }
  else {
    pCVar10 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock45.super_unique_lock);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1b9;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = pcVar12;
  assumed_tip = pCVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_b0 = &reload_all_block_indexes;
  reload_all_block_indexes.chainman._0_4_ = 0x78;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(assumed_tip->nHeight == 0x78);
  local_a8 = &assumed_tip->nHeight;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf7765b,(size_t)&local_a0,0x1b9,
             &criticalblock45.super_unique_lock,"120",&criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  reload_all_block_indexes.chainman = this_01;
  test_method::anon_class_8_1_3d09f077::operator()(&reload_all_block_indexes);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1cc;
  file_00.m_begin = (iterator)&local_128;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_138,
             msg_00);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_140 = (pCVar8->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_a8 = (int *)&local_140;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_140 == 1);
  local_144 = 1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77670,(size_t)&local_a0,0x1cc,&criticalblock45,"1",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (0 < (int)((ulong)((long)(pCVar8->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar8->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar16 = 0;
    do {
      criticalblock45.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock45.super_unique_lock._8_8_ =
           criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock45.super_unique_lock);
      ppCVar2 = (pCVar8->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (lVar16 < (int)((ulong)((long)(pCVar8->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2)
                        >> 3)) {
        pCVar10 = ppCVar2[lVar16];
      }
      else {
        pCVar10 = (CBlockIndex *)0x0;
      }
      iVar4 = (int)lVar16;
      if (iVar4 - 0x5bU < 0x14) {
        pCVar10->nStatus = 2;
        pCVar10->nTx = 0;
        pCVar10->m_chain_tx_count = 0;
      }
      num_indexes = num_indexes + 1;
      pCVar6 = pCVar10;
      if ((iVar4 != 0x6e) && (pCVar6 = assumed_base, iVar4 == 0x5a)) {
        validated_tip = pCVar10;
      }
      assumed_base = pCVar6;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock45.super_unique_lock);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)((ulong)((long)(pCVar8->m_chain).vChain.
                                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pCVar8->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  criticalblock46.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock46.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock46.super_unique_lock);
  puVar3 = assumed_base->phashBlock;
  criticalblock45.super_unique_lock._M_device =
       *(mutex_type **)(puVar3->super_base_blob<256U>).m_data._M_elems;
  pbVar5 = &puVar3->super_base_blob<256U>;
  criticalblock45.super_unique_lock._M_owns = (bool)(pbVar5->m_data)._M_elems[8];
  criticalblock45.super_unique_lock._9_1_ = (pbVar5->m_data)._M_elems[9];
  criticalblock45.super_unique_lock._10_1_ = (pbVar5->m_data)._M_elems[10];
  criticalblock45.super_unique_lock._11_1_ = (pbVar5->m_data)._M_elems[0xb];
  criticalblock45.super_unique_lock._12_1_ = (pbVar5->m_data)._M_elems[0xc];
  criticalblock45.super_unique_lock._13_1_ = (pbVar5->m_data)._M_elems[0xd];
  criticalblock45.super_unique_lock._14_1_ = (pbVar5->m_data)._M_elems[0xe];
  criticalblock45.super_unique_lock._15_1_ = (pbVar5->m_data)._M_elems[0xf];
  pCVar9 = ChainstateManager::ActivateExistingSnapshot
                     (this_01,(base_blob<256U>)
                              *(base_blob<256U> *)(puVar3->super_base_blob<256U>).m_data._M_elems);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock46.super_unique_lock);
  CChain::SetTip(&pCVar8->m_chain,validated_tip);
  CChain::SetTip(&pCVar9->m_chain,assumed_base);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1f1;
  file_01.m_begin = (iterator)&local_158;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_168,
             msg_01);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_a8 = &num_indexes;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(num_indexes == 0x79);
  local_140._0_4_ = 0x79;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_140;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77693,(size_t)&local_a0,0x1f1,&criticalblock45,
             "121",&criticalblock46.super_unique_lock);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1f2;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_140._0_4_ = 0x78;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(assumed_tip->nHeight == 0x78);
  local_a8 = &assumed_tip->nHeight;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_140;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf7765b,(size_t)&local_a0,0x1f2,&criticalblock45,
             "120",&criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1f3;
  file_03.m_begin = (iterator)&local_198;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a8,
             msg_03);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_140._0_4_ = 0x5a;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(validated_tip->nHeight == 0x5a);
  local_a8 = &validated_tip->nHeight;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_140;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf776a3,(size_t)&local_a0,499,&criticalblock45,"90",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1f4;
  file_04.m_begin = (iterator)&local_1b8;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c8,
             msg_04);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_140 = CONCAT44(local_140._4_4_,0x6e);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(assumed_base->nHeight == 0x6e);
  local_a8 = &assumed_base->nHeight;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_140;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf776ba,(size_t)&local_a0,500,&criticalblock45,"110",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  test_method::anon_class_8_1_3d09f077::operator()(&reload_all_block_indexes);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x20e;
  file_05.m_begin = (iterator)&local_1d8;
  msg_05.m_end = pvVar14;
  msg_05.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1e8,
             msg_05);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_140 = (pCVar8->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_140 == 2);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_144 = 2;
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock46.super_unique_lock._M_owns = false;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  local_a8 = (int *)&local_140;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77670,(size_t)&local_a0,0x20e,&criticalblock45,"2",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x20f;
  file_06.m_begin = (iterator)&local_1f8;
  msg_06.m_end = pvVar14;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_208,
             msg_06);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  cVar11 = std::
           _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
           ::find(&(pCVar8->setBlockIndexCandidates)._M_t,&validated_tip);
  p_Var15 = &(pCVar8->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Rb_tree_header *)cVar11._M_node != p_Var15);
  local_140 = (size_t)(byte)local_90.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value;
  local_144 = 1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  local_a8 = (int *)&local_140;
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf776d0,(size_t)&local_a0,0x20f,&criticalblock45,"1",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x210;
  file_07.m_begin = (iterator)&local_218;
  msg_07.m_end = pvVar14;
  msg_07.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_228,
             msg_07);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  cVar11 = std::
           _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
           ::find(&(pCVar8->setBlockIndexCandidates)._M_t,&assumed_base);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Rb_tree_header *)cVar11._M_node != p_Var15);
  local_140 = (size_t)(byte)local_90.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value;
  local_144 = 1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  local_a8 = (int *)&local_140;
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77701,(size_t)&local_a0,0x210,&criticalblock45,"1",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x220;
  file_08.m_begin = (iterator)&local_238;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_248,
             msg_08);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  this_00 = &pCVar9->setBlockIndexCandidates;
  cVar11 = std::
           _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
           ::find(&this_00->_M_t,&validated_tip);
  p_Var15 = &(pCVar9->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Rb_tree_header *)cVar11._M_node == p_Var15);
  local_140 = (size_t)!(bool)local_90.p_predicate_value.super_readonly_property<bool>.
                             super_class_property<bool>.value;
  local_144 = 0;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  local_a8 = (int *)&local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77731,(size_t)&local_a0,0x220,&criticalblock45,"0",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x222;
  file_09.m_begin = (iterator)&local_258;
  msg_09.m_end = pvVar14;
  msg_09.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_268,
             msg_09);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  cVar11 = std::
           _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
           ::find(&this_00->_M_t,&assumed_base->pprev);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Rb_tree_header *)cVar11._M_node == p_Var15);
  local_140 = (size_t)!(bool)local_90.p_predicate_value.super_readonly_property<bool>.
                             super_class_property<bool>.value;
  local_144 = 0;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  local_a8 = (int *)&local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77762,(size_t)&local_a0,0x222,&criticalblock45,"0",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x224;
  file_10.m_begin = (iterator)&local_278;
  msg_10.m_end = pvVar14;
  msg_10.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_288,
             msg_10);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  cVar11 = std::
           _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
           ::find(&this_00->_M_t,&assumed_base);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Rb_tree_header *)cVar11._M_node != p_Var15);
  local_140 = (size_t)(byte)local_90.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value;
  local_144 = 1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_a8 = (int *)&local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf77799,(size_t)&local_a0,0x224,&criticalblock45,"1",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x226;
  file_11.m_begin = (iterator)&local_298;
  msg_11.m_end = pvVar14;
  msg_11.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2a8,
             msg_11);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  cVar11 = std::
           _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
           ::find(&this_00->_M_t,&assumed_tip);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Rb_tree_header *)cVar11._M_node != p_Var15);
  local_140 = (size_t)(byte)local_90.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value;
  local_144 = 1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_a8 = (int *)&local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf777c9,(size_t)&local_a0,0x226,&criticalblock45,"1",
             &criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x228;
  file_12.m_begin = (iterator)&local_2b8;
  msg_12.m_end = pvVar14;
  msg_12.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2c8,
             msg_12);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_140 = (pCVar9->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_140 == (long)num_indexes - 0x6eU);
  local_144 = (undefined4)((long)num_indexes - 0x6eU);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_98 = "";
  local_a8 = (int *)&local_140;
  criticalblock45.super_unique_lock._8_8_ =
       criticalblock45.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock45.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abb70;
  local_b0 = (anon_class_8_1_3d09f077 *)&local_144;
  criticalblock46.super_unique_lock._M_owns = false;
  criticalblock46.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013abcf0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xf777f8,(size_t)&local_a0,0x228,&criticalblock45,
             "num_indexes - last_assumed_valid_idx + 1",&criticalblock46);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_loadblockindex, TestChain100Setup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    Chainstate& cs1 = chainman.ActiveChainstate();

    int num_indexes{0};
    // Blocks in range [assumed_valid_start_idx, last_assumed_valid_idx) will be
    // marked as assumed-valid and not having data.
    const int expected_assumed_valid{20};
    const int last_assumed_valid_idx{111};
    const int assumed_valid_start_idx = last_assumed_valid_idx - expected_assumed_valid;

    // Mine to height 120, past the hardcoded regtest assumeutxo snapshot at
    // height 110
    mineBlocks(20);

    CBlockIndex* validated_tip{nullptr};
    CBlockIndex* assumed_base{nullptr};
    CBlockIndex* assumed_tip{WITH_LOCK(chainman.GetMutex(), return chainman.ActiveChain().Tip())};
    BOOST_CHECK_EQUAL(assumed_tip->nHeight, 120);

    auto reload_all_block_indexes = [&]() {
        // For completeness, we also reset the block sequence counters to
        // ensure that no state which affects the ranking of tip-candidates is
        // retained (even though this isn't strictly necessary).
        WITH_LOCK(::cs_main, return chainman.ResetBlockSequenceCounters());
        for (Chainstate* cs : chainman.GetAll()) {
            LOCK(::cs_main);
            cs->ClearBlockIndexCandidates();
            BOOST_CHECK(cs->setBlockIndexCandidates.empty());
        }

        WITH_LOCK(::cs_main, chainman.LoadBlockIndex());
    };

    // Ensure that without any assumed-valid BlockIndex entries, only the current tip is
    // considered as a candidate.
    reload_all_block_indexes();
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.size(), 1);

    // Reset some region of the chain's nStatus, removing the HAVE_DATA flag.
    for (int i = 0; i <= cs1.m_chain.Height(); ++i) {
        LOCK(::cs_main);
        auto index = cs1.m_chain[i];

        // Blocks with heights in range [91, 110] are marked as missing data.
        if (i < last_assumed_valid_idx && i >= assumed_valid_start_idx) {
            index->nStatus = BlockStatus::BLOCK_VALID_TREE;
            index->nTx = 0;
            index->m_chain_tx_count = 0;
        }

        ++num_indexes;

        // Note the last fully-validated block as the expected validated tip.
        if (i == (assumed_valid_start_idx - 1)) {
            validated_tip = index;
        }
        // Note the last assumed valid block as the snapshot base
        if (i == last_assumed_valid_idx - 1) {
            assumed_base = index;
        }
    }

    // Note: cs2's tip is not set when ActivateExistingSnapshot is called.
    Chainstate& cs2 = WITH_LOCK(::cs_main,
        return chainman.ActivateExistingSnapshot(*assumed_base->phashBlock));

    // Set tip of the fully validated chain to be the validated tip
    cs1.m_chain.SetTip(*validated_tip);

    // Set tip of the assume-valid-based chain to the assume-valid block
    cs2.m_chain.SetTip(*assumed_base);

    // Sanity check test variables.
    BOOST_CHECK_EQUAL(num_indexes, 121); // 121 total blocks, including genesis
    BOOST_CHECK_EQUAL(assumed_tip->nHeight, 120);  // original chain has height 120
    BOOST_CHECK_EQUAL(validated_tip->nHeight, 90); // current cs1 chain has height 90
    BOOST_CHECK_EQUAL(assumed_base->nHeight, 110); // current cs2 chain has height 110

    // Regenerate cs1.setBlockIndexCandidates and cs2.setBlockIndexCandidate and
    // check contents below.
    reload_all_block_indexes();

    // The fully validated chain should only have the current validated tip and
    // the assumed valid base as candidates, blocks 90 and 110. Specifically:
    //
    // - It does not have blocks 0-89 because they contain less work than the
    //   chain tip.
    //
    // - It has block 90 because it has data and equal work to the chain tip,
    //   (since it is the chain tip).
    //
    // - It does not have blocks 91-109 because they do not contain data.
    //
    // - It has block 110 even though it does not have data, because
    //   LoadBlockIndex has a special case to always add the snapshot block as a
    //   candidate. The special case is only actually intended to apply to the
    //   snapshot chainstate cs2, not the background chainstate cs1, but it is
    //   written broadly and applies to both.
    //
    // - It does not have any blocks after height 110 because cs1 is a background
    //   chainstate, and only blocks where are ancestors of the snapshot block
    //   are added as candidates for the background chainstate.
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.size(), 2);
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.count(validated_tip), 1);
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.count(assumed_base), 1);

    // The assumed-valid tolerant chain has the assumed valid base as a
    // candidate, but otherwise has none of the assumed-valid (which do not
    // HAVE_DATA) blocks as candidates.
    //
    // Specifically:
    // - All blocks below height 110 are not candidates, because cs2 chain tip
    //   has height 110 and they have less work than it does.
    //
    // - Block 110 is a candidate even though it does not have data, because it
    //   is the snapshot block, which is assumed valid.
    //
    // - Blocks 111-120 are added because they have data.

    // Check that block 90 is absent
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(validated_tip), 0);
    // Check that block 109 is absent
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_base->pprev), 0);
    // Check that block 110 is present
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_base), 1);
    // Check that block 120 is present
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_tip), 1);
    // Check that 11 blocks total are present.
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.size(), num_indexes - last_assumed_valid_idx + 1);
}